

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_packet.cxx
# Opt level: O0

void __thiscall xray_re::xr_packet::w_sdir(xr_packet *this,fvector3 *value)

{
  uint16_t uVar1;
  undefined8 extraout_RDX;
  float local_28;
  undefined1 local_24 [4];
  float m;
  fvector3 temp;
  fvector3 *value_local;
  xr_packet *this_local;
  
  temp.field_0._4_8_ = value;
  local_28 = _vector3<float>::square_magnitude(value);
  if (1e-07 <= local_28) {
    _vector3<float>::mul
              ((_vector3<float> *)local_24,(_vector3<float> *)temp.field_0._4_8_,1.0 / local_28);
  }
  else {
    _vector3<float>::set((_vector3<float> *)local_24,0.0,0.0,0.0);
    local_28 = 0.0;
  }
  uVar1 = _vector3<float>::compress((_vector3<float> *)local_24);
  (*this->_vptr_xr_packet[8])(this,(ulong)uVar1,extraout_RDX,uVar1);
  (*this->_vptr_xr_packet[0xd])(local_28);
  return;
}

Assistant:

void xr_packet::w_sdir(const fvector3& value)
{
	fvector3 temp;
	float m = value.square_magnitude();
	if (m < 1e-7f) {
		temp.set(0, 0, 0);
		m = 0;
	} else {
		temp.mul(value, 1.f/m);
	}
	w_u16(temp.compress());
	w_float(m);
}